

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

void __thiscall
icu_63::TimeZoneNamesImpl::ZoneStringsLoader::load(ZoneStringsLoader *this,UErrorCode *status)

{
  char *pcVar1;
  char *pcVar2;
  UHashtable *pUVar3;
  UBool UVar4;
  UHashElement *pUVar5;
  size_t sVar6;
  long lVar7;
  int32_t pos;
  UnicodeString mzID;
  int32_t local_7c;
  ZoneStringsLoader *local_78;
  UnicodeString local_70;
  
  ures_getAllItemsWithFallback_63(this->tzn->fZoneStrings,"",&this->super_ResourceSink,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_7c = -1;
    pUVar5 = uhash_nextElement_63(this->keyToLoader,&local_7c);
    local_78 = this;
    while (pUVar5 != (UHashElement *)0x0) {
      pcVar1 = (char *)(pUVar5->value).pointer;
      if (pcVar1 != "<dummy>") {
        pcVar2 = (char *)(pUVar5->key).pointer;
        UVar4 = isMetaZone(this,pcVar2);
        if (UVar4 == '\0') {
          tzIDFromKey(&local_70,this,pcVar2);
          pUVar3 = this->tzn->fTZNamesMap;
          lVar7 = 1;
          do {
            if (*(undefined2 **)(pcVar1 + lVar7 * 8) == &NO_NAME) {
              pcVar2 = pcVar1 + lVar7 * 8;
              pcVar2[0] = '\0';
              pcVar2[1] = '\0';
              pcVar2[2] = '\0';
              pcVar2[3] = '\0';
              pcVar2[4] = '\0';
              pcVar2[5] = '\0';
              pcVar2[6] = '\0';
              pcVar2[7] = '\0';
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != 8);
          ZNames::createTimeZoneAndPutInCache(pUVar3,(UChar **)(pcVar1 + 8),&local_70,status);
          UnicodeString::~UnicodeString(&local_70);
        }
        else {
          sVar6 = strlen(pcVar2);
          UnicodeString::UnicodeString(&local_70,pcVar2 + 5,(int)sVar6 + -5,kInvariant);
          pUVar3 = this->tzn->fMZNamesMap;
          lVar7 = 1;
          do {
            if (*(undefined2 **)(pcVar1 + lVar7 * 8) == &NO_NAME) {
              pcVar2 = pcVar1 + lVar7 * 8;
              pcVar2[0] = '\0';
              pcVar2[1] = '\0';
              pcVar2[2] = '\0';
              pcVar2[3] = '\0';
              pcVar2[4] = '\0';
              pcVar2[5] = '\0';
              pcVar2[6] = '\0';
              pcVar2[7] = '\0';
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != 8);
          ZNames::createMetaZoneAndPutInCache(pUVar3,(UChar **)(pcVar1 + 8),&local_70,status);
          UnicodeString::~UnicodeString(&local_70);
        }
        this = local_78;
        if (U_ZERO_ERROR < *status) {
          return;
        }
      }
      pUVar5 = uhash_nextElement_63(this->keyToLoader,&local_7c);
    }
  }
  return;
}

Assistant:

void load(UErrorCode& status) {
        ures_getAllItemsWithFallback(tzn.fZoneStrings, "", *this, status);
        if (U_FAILURE(status)) { return; }

        int32_t pos = UHASH_FIRST;
        const UHashElement* element;
        while ((element = uhash_nextElement(keyToLoader, &pos)) != NULL) {
            if (element->value.pointer == DUMMY_LOADER) { continue; }
            ZNames::ZNamesLoader* loader = (ZNames::ZNamesLoader*) element->value.pointer;
            char* key = (char*) element->key.pointer;

            if (isMetaZone(key)) {
                UnicodeString mzID = mzIDFromKey(key);
                ZNames::createMetaZoneAndPutInCache(tzn.fMZNamesMap, loader->getNames(), mzID, status);
            } else {
                UnicodeString tzID = tzIDFromKey(key);
                ZNames::createTimeZoneAndPutInCache(tzn.fTZNamesMap, loader->getNames(), tzID, status);
            }
            if (U_FAILURE(status)) { return; }
        }
    }